

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wordlist.c
# Opt level: O0

words * wordlist_alloc(char *words,size_t len)

{
  words *w_00;
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  char **ppcVar4;
  words *w;
  size_t len_local;
  char *words_local;
  
  w_00 = (words *)wally_malloc(0x30);
  if (w_00 != (words *)0x0) {
    wally_clear(w_00,0x30);
    pcVar1 = wally_strdup(words);
    w_00->str = pcVar1;
    if (w_00->str != (char *)0x0) {
      sVar2 = strlen(w_00->str);
      w_00->str_len = sVar2;
      w_00->len = len;
      sVar3 = get_bits(len);
      w_00->bits = sVar3;
      ppcVar4 = (char **)wally_malloc(len << 3);
      w_00->indices = ppcVar4;
      if (w_00->indices != (char **)0x0) {
        return w_00;
      }
    }
    wordlist_free(w_00);
  }
  return (words *)0x0;
}

Assistant:

static struct words *wordlist_alloc(const char *words, size_t len)
{
    struct words *w = wally_malloc(sizeof(struct words));
    if (w) {
        wally_clear(w, sizeof(*w));
        w->str = wally_strdup(words);
        if (w->str) {
            w->str_len = strlen(w->str);
            w->len = len;
            w->bits = get_bits(len);
            w->indices = wally_malloc(len * sizeof(const char *));
            if (w->indices)
                return w;
        }
        wordlist_free(w);
    }
    return NULL;
}